

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>),std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>const&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *a,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_1,
          bitfield_flag<unsigned_char,_libtorrent::reannounce_flags_tag,_void> *a_2)

{
  bool bVar1;
  element_type *this_00;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R9;
  undefined1 local_d0 [40];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a8;
  string local_a0 [40];
  session_impl *local_78;
  session_impl *ses;
  error_code_enum local_5c;
  undefined1 local_58 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  bitfield_flag<unsigned_char,_libtorrent::reannounce_flags_tag,_void> *a_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_local_1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *a_local;
  offset_in_torrent_to_subr f_local;
  torrent_handle *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_R9;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_58);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
  if (!bVar1) {
    local_5c = invalid_torrent_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_5c);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_58);
  local_78 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ctx = libtorrent::aux::session_impl::get_context(local_78);
  local_d0._0_8_ = local_78;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)(local_d0 + 8),
             (shared_ptr<libtorrent::aux::torrent> *)local_58);
  local_a8.__d.__r = *(duration *)a_1;
  local_d0._24_8_ = f;
  local_d0._32_8_ = a;
  ::std::__cxx11::string::string(local_a0,(string *)a_2);
  local_a0[0x20] =
       *(string *)
        &(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_vptr__Sp_counted_base;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>),std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>const&>(void(libtorrent::aux::torrent::*)(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>),std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&&,std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::reannounce_flags_tag,void>const&)const::_lambda()_1_>
            (ctx,(type_conflict17 *)local_d0,(type *)0x0);
  const::{lambda()#1}::~async_call((_lambda___1_ *)local_d0);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_58);
  return;
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}